

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O0

void __thiscall
Dijkstra::Dijkstra(Dijkstra *this,int _s,vvi_t *_en,vvi_t *_in,vvi_t *_ou,
                  vector<int,_std::allocator<int>_> *_ws)

{
  size_type sVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RCX;
  undefined4 in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff60;
  pointer *this_00;
  pointer *__x;
  
  (((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
     *)&in_RDI->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).super__Vector_impl_data.
  _M_start = (pointer)&PTR__Dijkstra_0031da38;
  *(undefined4 *)
   &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       *)&in_RDI->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).super__Vector_impl_data.
    _M_finish = in_ESI;
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(in_RCX);
  *(int *)((long)&(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)&in_RDI->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
                  super__Vector_impl_data._M_finish + 4) = (int)sVar1;
  __x = &(((_Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&in_RDI->super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
         super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_RDI,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)__x);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x29c59e);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x29c5b1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x29c5c7);
  std::vector<int,_std::allocator<int>_>::vector(in_RDI,(vector<int,_std::allocator<int>_> *)__x);
  this_00 = &in_RDI[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x29c5fa);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x29c610);
  *(undefined1 *)
   &in_RDI[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  std::
  priority_queue<Dijkstra::tuple,std::vector<Dijkstra::tuple,std::allocator<Dijkstra::tuple>>,Dijkstra::Priority>
  ::priority_queue<std::vector<Dijkstra::tuple,std::allocator<Dijkstra::tuple>>,void>
            ((priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
              *)this_00);
  return;
}

Assistant:

Dijkstra::Dijkstra(int _s, vvi_t _en, const vvi_t& _in, vvi_t _ou, std::vector<int>& _ws)
		: source(_s),
			nb_nodes(static_cast<int>(_in.size())),
			en(std::move(_en)),
			in(_in),
			out(std::move(_ou)),
			ws(_ws),
			verbose(false) {}